

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O3

void __thiscall
swrenderer::FWallTmapVals::InitFromLine(FWallTmapVals *this,DVector2 *left,DVector2 *right)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar3 = ViewSin * left->X - ViewCos * left->Y;
  dVar2 = ViewSin * right->X - ViewCos * right->Y;
  if ((_MirrorFlags & 1) != 0) {
    dVar3 = -dVar3;
    dVar2 = -dVar2;
  }
  dVar5 = right->X * ViewTanCos;
  dVar4 = right->Y * ViewTanSin;
  dVar6 = (double)centerx;
  dVar1 = left->Y * ViewTanSin + left->X * ViewTanCos;
  this->UoverZorg = (float)(dVar3 * dVar6);
  this->UoverZstep = -(float)dVar1;
  this->InvZorg = (float)((dVar3 - dVar2) * dVar6);
  this->InvZstep = (float)((dVar4 + dVar5) - dVar1);
  return;
}

Assistant:

void FWallTmapVals::InitFromLine(const DVector2 &left, const DVector2 &right)
{ // Coordinates should have already had viewx,viewy subtracted
	double fullx1 = left.X * ViewSin - left.Y * ViewCos;
	double fullx2 = right.X * ViewSin - right.Y * ViewCos;
	double fully1 = left.X * ViewTanCos + left.Y * ViewTanSin;
	double fully2 = right.X * ViewTanCos + right.Y * ViewTanSin;

	if (MirrorFlags & RF_XFLIP)
	{
		fullx1 = -fullx1;
		fullx2 = -fullx2;
	}

	UoverZorg = float(fullx1 * centerx);
	UoverZstep = float(-fully1);
	InvZorg = float((fullx1 - fullx2) * centerx);
	InvZstep = float(fully2 - fully1);
}